

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

double nk_strtod(char *str,char **endptr)

{
  char *pcVar1;
  bool bVar2;
  int div;
  int pow;
  int i;
  double number;
  double value;
  char *p;
  double neg;
  double m;
  char **endptr_local;
  char *str_local;
  double local_8;
  
  neg = 1.0;
  value = 0.0;
  p = str;
  if (str == (char *)0x0) {
    local_8 = 0.0;
  }
  else {
    for (; *p == ' '; p = p + 1) {
    }
    if (*p == '-') {
      neg = -1.0;
      p = p + 1;
    }
    while( true ) {
      bVar2 = false;
      if ((*p != '\0') && (bVar2 = false, *p != '.')) {
        bVar2 = *p != 'e';
      }
      if (!bVar2) break;
      value = value * 10.0 + (double)(*p + -0x30);
      p = p + 1;
    }
    if (*p == '.') {
      m = 0.1;
      while( true ) {
        p = p + 1;
        bVar2 = false;
        if (*p != '\0') {
          bVar2 = *p != 'e';
        }
        if (!bVar2) break;
        value = (double)(*p + -0x30) * m + value;
        m = m * 0.1;
      }
    }
    if (*p == 'e') {
      pcVar1 = p + 1;
      if (*pcVar1 == '-') {
        bVar2 = true;
        p = p + 2;
      }
      else {
        if (*pcVar1 == '+') {
          pcVar1 = p + 2;
        }
        p = pcVar1;
        bVar2 = false;
      }
      pow = 0;
      for (; *p != '\0'; p = p + 1) {
        pow = pow * 10 + *p + -0x30;
      }
      m = 1.0;
      for (i = 0; i < pow; i = i + 1) {
        m = m * 10.0;
      }
      if (bVar2) {
        value = value / m;
      }
      else {
        value = m * value;
      }
    }
    local_8 = value * neg;
    if (endptr != (char **)0x0) {
      *endptr = p;
    }
  }
  return local_8;
}

Assistant:

NK_API double
nk_strtod(const char *str, const char **endptr)
{
double m;
double neg = 1.0;
const char *p = str;
double value = 0;
double number = 0;

NK_ASSERT(str);
if (!str) return 0;

/* skip whitespace */
while (*p == ' ') p++;
if (*p == '-') {
neg = -1.0;
p++;
}

while (*p && *p != '.' && *p != 'e') {
value = value * 10.0 + (double) (*p - '0');
p++;
}

if (*p == '.') {
p++;
for(m = 0.1; *p && *p != 'e'; p++ ) {
value = value + (double) (*p - '0') * m;
m *= 0.1;
}
}
if (*p == 'e') {
int i, pow, div;
p++;
if (*p == '-') {
div = nk_true;
p++;
} else if (*p == '+') {
div = nk_false;
p++;
} else div = nk_false;

for (pow = 0; *p; p++)
pow = pow * 10 + (int) (*p - '0');

for (m = 1.0, i = 0; i < pow; i++)
m *= 10.0;

if (div)
value /= m;
else value *= m;
}
number = value * neg;
if (endptr)
*endptr = p;
return number;
}